

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentFunctors.h
# Opt level: O0

void __thiscall
Eigen::internal::swap_assign_op<double>::swap_assign_op(swap_assign_op<double> *this)

{
  swap_assign_op<double> *this_local;
  
  return;
}

Assistant:

void assignCoeff(Scalar& a, const Scalar& b) const
  {
#ifdef EIGEN_GPUCC
    // FIXME is there some kind of cuda::swap?
    Scalar t=b; const_cast<Scalar&>(b)=a; a=t;
#else
    using std::swap;
    swap(a,const_cast<Scalar&>(b));
#endif
  }